

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::bindRefArg
          (Type *lhs,bitmask<slang::ast::VariableFlags> argFlags,ExpressionSyntax *rhs,
          SourceLocation location,ASTContext *context)

{
  SourceRange range;
  SourceRange range_00;
  bool bVar1;
  Compilation *diag_00;
  Symbol *pSVar2;
  undefined8 in_RCX;
  Type *in_RDX;
  undefined2 in_SI;
  SourceLocation in_RDI;
  Symbol *in_R8;
  Expression *in_stack_00000038;
  ASTContext *in_stack_00000040;
  Expression *in_stack_00000048;
  bitmask<slang::ast::AssignFlags> in_stack_00000057;
  SourceLocation in_stack_00000058;
  Symbol *sym;
  Diagnostic *diag;
  DiagCode code;
  bool isConstRef;
  Expression *expr;
  Compilation *comp;
  Expression *in_stack_fffffffffffffed8;
  Compilation *in_stack_fffffffffffffee0;
  Expression *pEVar3;
  undefined1 isLValue;
  SourceLocation in_stack_fffffffffffffee8;
  SourceLocation in_stack_fffffffffffffef0;
  SourceLocation in_stack_fffffffffffffef8;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff00;
  DiagCode code_00;
  bool local_e9;
  undefined8 in_stack_ffffffffffffff20;
  undefined1 allowPacked;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined2 uVar4;
  ASTContext *in_stack_ffffffffffffff48;
  bitmask<slang::ast::VariableFlags> in_stack_ffffffffffffff54;
  bitmask<slang::ast::AssignFlags> local_a9;
  SourceLocation local_a8;
  SourceLocation local_a0;
  SourceLocation local_98;
  undefined8 local_90;
  undefined4 local_84;
  Diagnostic *local_80;
  SourceLocation local_78;
  SourceLocation local_70;
  undefined8 local_68;
  undefined4 local_60;
  underlying_type local_5c;
  underlying_type local_5a;
  bitmask<slang::ast::VariableFlags> local_58;
  bitmask<slang::ast::VariableFlags> local_56;
  underlying_type local_54;
  undefined4 local_52;
  undefined2 local_4e;
  bitmask<slang::ast::VariableFlags> local_4c;
  byte local_49;
  bitmask<slang::ast::ASTFlags> local_48;
  Expression *local_40;
  Compilation *local_38;
  undefined8 local_30;
  Type *local_28;
  SourceLocation local_20;
  undefined8 local_18;
  undefined2 local_a;
  Expression *local_8;
  
  allowPacked = (undefined1)((ulong)in_stack_ffffffffffffff20 >> 0x38);
  local_30 = in_R8;
  local_28 = in_RDX;
  local_20 = in_RDI;
  local_18 = in_RCX;
  local_a = in_SI;
  diag_00 = ASTContext::getCompilation((ASTContext *)0x99033f);
  pSVar2 = local_30;
  local_38 = diag_00;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_48,None);
  local_40 = selfDetermined((Compilation *)in_stack_fffffffffffffef8,
                            (ExpressionSyntax *)in_stack_fffffffffffffef0,
                            (ASTContext *)in_stack_fffffffffffffee8,in_stack_ffffffffffffff00);
  code_00 = SUB84(in_stack_ffffffffffffff00.m_bits >> 0x20,0);
  bVar1 = bad((Expression *)in_stack_fffffffffffffee0);
  if (bVar1) {
    local_8 = local_40;
  }
  else {
    bVar1 = Type::isError((Type *)0x9903d8);
    if (bVar1) {
      local_8 = badExpr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
    else {
      bitmask<slang::ast::VariableFlags>::bitmask(&local_4c,Const);
      local_49 = bitmask<slang::ast::VariableFlags>::has
                           ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffee0,
                            (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffed8);
      local_4e = local_a;
      bVar1 = canConnectToRefArg(in_stack_ffffffffffffff48,(Expression *)pSVar2,
                                 in_stack_ffffffffffffff54,SUB81((ulong)local_28 >> 0x38,0),
                                 SUB81((ulong)local_28 >> 0x30,0));
      if (bVar1) {
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0x990679);
        bVar1 = Type::isEquivalent(local_28,(Type *)diag_00);
        if (bVar1) {
          if ((local_49 & 1) == 0) {
            pEVar3 = local_40;
            SourceLocation::SourceLocation(&local_a8);
            isLValue = (undefined1)((ulong)pEVar3 >> 0x38);
            memset(&local_a9,0,1);
            bitmask<slang::ast::AssignFlags>::bitmask(&local_a9);
            requireLValue(in_stack_00000048,in_stack_00000040,in_stack_00000058,in_stack_00000057,
                          in_stack_00000038);
            pSVar2 = getSymbolReference((Expression *)
                                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28
                                                ),(bool)allowPacked);
            if (pSVar2 != (Symbol *)0x0) {
              Compilation::noteReference
                        ((Compilation *)in_stack_fffffffffffffef0,local_30,(bool)isLValue);
            }
          }
          local_8 = local_40;
        }
        else {
          local_84 = 0x920007;
          local_90 = local_18;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffef0,code_00,local_20);
          local_a0 = (local_40->sourceRange).startLoc;
          local_98 = (local_40->sourceRange).endLoc;
          range_00.endLoc = in_stack_fffffffffffffef0;
          range_00.startLoc = in_stack_fffffffffffffee8;
          local_80 = Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffee0,range_00);
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x990725);
          ast::operator<<((Diagnostic *)diag_00,
                          (Type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
          ast::operator<<((Diagnostic *)diag_00,
                          (Type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
          local_8 = badExpr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        }
      }
      else {
        local_52 = 0x660007;
        bVar1 = false;
        if ((local_49 & 1) == 0) {
          bitmask<slang::ast::VariableFlags>::bitmask(&local_56,Const);
          local_54 = (underlying_type)
                     bitmask<slang::ast::VariableFlags>::operator|
                               ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffee8,
                                (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffee0);
          bVar1 = canConnectToRefArg(in_stack_ffffffffffffff48,(Expression *)pSVar2,
                                     in_stack_ffffffffffffff54,SUB81((ulong)local_28 >> 0x38,0),
                                     SUB81((ulong)local_28 >> 0x30,0));
        }
        uVar4 = (undefined2)((ulong)local_28 >> 0x30);
        if (bVar1 == false) {
          bitmask<slang::ast::VariableFlags>::bitmask(&local_58,RefStatic);
          bVar1 = bitmask<slang::ast::VariableFlags>::has
                            ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffee0,
                             (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffed8);
          local_e9 = false;
          if (bVar1) {
            code_00 = local_30._4_4_;
            local_5c = (underlying_type)ast::operator~(None);
            local_5a = (underlying_type)
                       bitmask<slang::ast::VariableFlags>::operator&
                                 ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffee8,
                                  (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffee0);
            local_e9 = canConnectToRefArg(in_stack_ffffffffffffff48,(Expression *)pSVar2,
                                          in_stack_ffffffffffffff54,SUB21((ushort)uVar4 >> 8,0),
                                          SUB21(uVar4,0));
          }
          if (local_e9 != false) {
            local_52 = 0x1c0007;
          }
        }
        else {
          local_52 = 0x430007;
        }
        local_60 = local_52;
        local_68 = local_18;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffef0,code_00,
                            in_stack_fffffffffffffef8);
        local_78 = (local_40->sourceRange).startLoc;
        local_70 = (local_40->sourceRange).endLoc;
        range.endLoc = in_stack_fffffffffffffef0;
        range.startLoc = in_stack_fffffffffffffee8;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffee0,range);
        local_8 = badExpr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      }
    }
  }
  return local_8;
}

Assistant:

const Expression& Expression::bindRefArg(const Type& lhs, bitmask<VariableFlags> argFlags,
                                         const ExpressionSyntax& rhs, SourceLocation location,
                                         const ASTContext& context) {
    Compilation& comp = context.getCompilation();
    Expression& expr = selfDetermined(comp, rhs, context);
    if (expr.bad())
        return expr;

    if (lhs.isError())
        return badExpr(comp, &expr);

    const bool isConstRef = argFlags.has(VariableFlags::Const);
    if (!canConnectToRefArg(context, expr, argFlags)) {
        DiagCode code = diag::InvalidRefArg;
        if (!isConstRef && canConnectToRefArg(context, expr, argFlags | VariableFlags::Const)) {
            // If we can't bind to ref but we can bind to 'const ref', issue a more
            // specific error about constness.
            code = diag::ConstVarToRef;
        }
        else if (argFlags.has(VariableFlags::RefStatic) &&
                 canConnectToRefArg(context, expr, argFlags & ~VariableFlags::RefStatic)) {
            // Same idea, but for ref static restrictions.
            code = diag::AutoVarToRefStatic;
        }

        context.addDiag(code, location) << expr.sourceRange;
        return badExpr(comp, &expr);
    }

    if (!lhs.isEquivalent(*expr.type)) {
        auto& diag = context.addDiag(diag::RefTypeMismatch, location) << expr.sourceRange;
        diag << *expr.type << lhs;
        return badExpr(comp, &expr);
    }

    // ref args are considered drivers unless they are const.
    if (!isConstRef) {
        // The check for ref-args is more strict than the check for lvalues,
        // so the net effect of this call is to get a driver registered for
        // us without duplicating the logic for determining longest static prefix.
        expr.requireLValue(context);
        if (auto sym = expr.getSymbolReference())
            comp.noteReference(*sym, /* isLValue */ true);
    }

    return expr;
}